

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  KeyInfo *pKVar2;
  u8 uVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Mem *pMem2;
  char *__s2;
  ulong uVar12;
  uint uVar13;
  u64 v;
  uint uVar14;
  bool bVar15;
  ulong local_b0;
  uint local_a8;
  uint local_a4;
  UnpackedRecord *local_a0;
  u8 *local_98;
  uint local_90;
  uint local_8c;
  void *local_88;
  double local_80;
  long local_78;
  long local_70;
  Mem mem1;
  
  pMem2 = pPKey2->aMem;
  local_a4 = nKey1;
  local_a0 = pPKey2;
  if (bSkip == 0) {
    local_8c = (uint)*pKey1;
    if ((char)*pKey1 < '\0') {
      bVar4 = sqlite3GetVarint32((uchar *)pKey1,&local_8c);
      uVar10 = (uint)bVar4;
    }
    else {
      uVar10 = 1;
    }
    local_b0 = 0;
    uVar14 = local_8c;
    local_90 = local_8c;
  }
  else {
    mem1.u.nZero = (int)*(byte *)((long)pKey1 + 1);
    if ((char)*(byte *)((long)pKey1 + 1) < '\0') {
      uVar3 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&mem1);
      uVar10 = (uint)(byte)(uVar3 + 1);
    }
    else {
      uVar10 = 2;
    }
    if ((uint)mem1.u.nZero < 0x80) {
      uVar14 = (uint)""[(uint)mem1.u.nZero];
    }
    else {
      uVar14 = mem1.u.nZero - 0xcU >> 1;
    }
    pMem2 = pMem2 + 1;
    local_b0 = 1;
    uVar14 = uVar14 + *pKey1;
    local_90 = (uint)*pKey1;
  }
  if (local_a4 < uVar14) {
    iVar6 = sqlite3CorruptError(0x151e1);
    local_a0->errCode = (u8)iVar6;
    return 0;
  }
  local_98 = &local_a0->errCode;
  local_88 = pKey1;
  do {
    uVar5 = pMem2->flags;
    uVar7 = (ulong)uVar10;
    uVar12 = (ulong)uVar14;
    if ((uVar5 & 0x24) == 0) {
      if ((uVar5 & 8) != 0) {
        bVar4 = *(byte *)((long)pKey1 + uVar7);
        v = (u64)bVar4;
        if (9 < bVar4) goto LAB_00170cd1;
        if (bVar4 == 0) {
          uVar13 = 0;
          goto LAB_00170cf9;
        }
        sqlite3VdbeSerialGet((uchar *)(uVar12 + (long)pKey1),(uint)bVar4,&mem1);
        dVar1 = (pMem2->u).r;
        if (bVar4 == 7) {
          if (dVar1 <= (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero)) {
            v = 7;
            if (dVar1 < (double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero)) {
              uVar9 = 1;
              uVar11 = uVar9;
              goto LAB_00170d1e;
            }
            goto LAB_00170bd6;
          }
        }
        else {
          local_78 = CONCAT44(mem1.u.i._4_4_,mem1.u.nZero);
          if (dVar1 <= (double)local_78) {
            uVar13 = (uint)(dVar1 < (double)local_78);
            local_80 = dVar1;
            goto LAB_0017097b;
          }
        }
        uVar13 = 1;
        goto LAB_00170d04;
      }
      if ((uVar5 & 2) == 0) {
        bVar4 = *(byte *)((long)pKey1 + uVar7);
        v = (u64)bVar4;
        uVar13 = (uint)bVar4;
        if ((uVar5 & 0x10) == 0) {
          uVar13 = (uint)(uVar13 != 10 && uVar13 != 0);
        }
        else {
          local_a8 = uVar13;
          if ((char)bVar4 < '\0') {
            sqlite3GetVarint32((uchar *)(uVar7 + (long)pKey1),&local_a8);
            v = (u64)local_a8;
          }
          uVar13 = (uint)v;
          if ((uVar13 < 0xc) || ((v & 1) != 0)) goto LAB_00170cf9;
          uVar9 = uVar13 - 0xc >> 1;
          if (local_a4 < uVar9 + uVar14) {
            iVar6 = 0x1524c;
            goto LAB_00170cc0;
          }
          if ((pMem2->flags & 0x400) == 0) {
            uVar11 = pMem2->n;
            uVar13 = uVar9 - uVar11;
            if ((int)uVar9 < (int)uVar11) {
              uVar11 = uVar9;
            }
            __s2 = pMem2->z;
LAB_00170c70:
            uVar11 = memcmp((void *)(uVar12 + (long)pKey1),__s2,(long)(int)uVar11);
            if (uVar11 != 0) {
              uVar9 = 1;
              goto LAB_00170d1e;
            }
          }
          else {
            iVar6 = isAllZero((char *)(uVar12 + (long)pKey1),uVar9);
            if (iVar6 == 0) goto LAB_00170d13;
            uVar13 = uVar9 - (pMem2->u).nZero;
          }
        }
      }
      else {
        bVar4 = *(byte *)((long)pKey1 + uVar7);
        v = (u64)bVar4;
        local_a8 = (uint)bVar4;
        if ((char)bVar4 < '\0') {
          sqlite3GetVarint32((uchar *)(uVar7 + (long)pKey1),&local_a8);
          v = (u64)local_a8;
        }
        uVar13 = (uint)v;
        if (uVar13 < 0xc) {
LAB_00170cf9:
          uVar9 = uVar13;
          uVar11 = 0xffffffff;
          goto LAB_00170d1e;
        }
        if ((v & 1) == 0) goto LAB_00170d13;
        mem1.n = uVar13 - 0xc >> 1;
        if ((local_a4 < mem1.n + uVar14) ||
           (pKVar2 = local_a0->pKeyInfo, pKVar2->nAllField <= local_b0)) {
          iVar6 = 0x1522e;
          goto LAB_00170cc0;
        }
        if (pKVar2->aColl[local_b0] == (CollSeq *)0x0) {
          uVar11 = pMem2->n;
          uVar13 = mem1.n - uVar11;
          if (mem1.n < (int)uVar11) {
            uVar11 = mem1.n;
          }
          __s2 = pMem2->z;
          goto LAB_00170c70;
        }
        mem1.enc = pKVar2->enc;
        mem1.db = pKVar2->db;
        mem1.flags = 2;
        mem1.z = (char *)(uVar12 + (long)pKey1);
        uVar13 = vdbeCompareMemString(&mem1,pMem2,pKVar2->aColl[local_b0],local_98);
      }
LAB_0017097b:
      uVar9 = (uint)v;
      uVar11 = uVar13;
      if (uVar13 != 0) goto LAB_00170d1e;
      goto LAB_00170bd6;
    }
    bVar4 = *(byte *)((long)pKey1 + uVar7);
    v = (u64)bVar4;
    uVar9 = (uint)bVar4;
    if (9 < bVar4) {
LAB_00170cd1:
      uVar11 = (uint)(bVar4 != 10) * 2 - 1;
      bVar15 = false;
      goto LAB_00170d24;
    }
    if (bVar4 == 7) {
      sqlite3VdbeSerialGet((uchar *)(uVar12 + (long)pKey1),7,&mem1);
      local_70 = (pMem2->u).i;
      if ((double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero) <= (double)local_70) {
        uVar13 = -(uint)((double)CONCAT44(mem1.u.i._4_4_,mem1.u.nZero) < (double)local_70);
        v = 7;
        goto LAB_0017097b;
      }
LAB_00170d13:
      uVar9 = 1;
      uVar11 = uVar9;
      goto LAB_00170d1e;
    }
    uVar13 = (uint)bVar4;
    if (bVar4 == 0) goto LAB_00170cf9;
    switch(bVar4) {
    case 1:
      uVar7 = (ulong)*(char *)((long)pKey1 + uVar12);
      goto LAB_00170bbe;
    case 2:
      uVar8 = (long)*(char *)((long)pKey1 + uVar12) << 8;
      uVar7 = (ulong)*(byte *)((long)pKey1 + uVar12 + 1);
      break;
    case 3:
      uVar8 = (ulong)*(byte *)((long)pKey1 + uVar12 + 1) << 8 |
              (long)*(char *)((long)pKey1 + uVar12) << 0x10;
      uVar7 = (ulong)*(byte *)((long)pKey1 + uVar12 + 2);
      break;
    case 4:
      uVar8 = (ulong)*(byte *)((long)pKey1 + uVar12 + 2) << 8 |
              (long)(int)((uint)*(byte *)((long)pKey1 + uVar12) << 0x18) |
              (ulong)*(byte *)((long)pKey1 + uVar12 + 1) << 0x10;
      uVar7 = (ulong)*(byte *)((long)pKey1 + uVar12 + 3);
      break;
    case 5:
      uVar13 = *(uint *)((long)pKey1 + uVar12 + 2);
      uVar8 = (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18);
      uVar7 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar12),
                                         *(undefined1 *)((long)pKey1 + uVar12 + 1)) << 0x20;
      break;
    case 6:
      uVar7 = *(ulong *)((long)pKey1 + uVar12);
      uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
              | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18
              | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      goto LAB_00170bbe;
    default:
      uVar7 = (ulong)(bVar4 - 8);
      goto LAB_00170bbe;
    }
    uVar7 = uVar7 | uVar8;
LAB_00170bbe:
    uVar13 = (uint)bVar4;
    if ((long)uVar7 < (pMem2->u).i) {
LAB_00170d04:
      uVar9 = uVar13;
      uVar11 = 0xffffffff;
LAB_00170d1e:
      bVar15 = uVar9 == 0;
LAB_00170d24:
      bVar4 = local_a0->pKeyInfo->aSortFlags[local_b0 & 0xffffffff];
      if (bVar4 == 0) {
        return uVar11;
      }
      if ((bVar4 & 2) != 0) {
        if (bVar15) {
          uVar5 = 1;
        }
        else {
          uVar5 = pMem2->flags & 1;
        }
        if ((bVar4 & 1) == uVar5) {
          return uVar11;
        }
      }
      return -uVar11;
    }
    if ((pMem2->u).i < (long)uVar7) {
      uVar11 = 1;
      goto LAB_00170d1e;
    }
LAB_00170bd6:
    pKey1 = local_88;
    local_b0 = local_b0 + 1;
    if (local_b0 == local_a0->nField) {
LAB_00170ca9:
      local_a0->eqSeen = '\x01';
      return (int)local_a0->default_rc;
    }
    if ((uint)v < 0x80) {
      uVar13 = (uint)""[v];
    }
    else {
      uVar13 = (uint)v - 0xc >> 1;
    }
    uVar14 = uVar14 + uVar13;
    if (local_a4 < uVar14) goto LAB_00170ca9;
    iVar6 = sqlite3VarintLen(v);
    uVar10 = uVar10 + iVar6;
    if (local_90 <= uVar10) {
      iVar6 = 0x15278;
LAB_00170cc0:
      iVar6 = sqlite3CorruptError(iVar6);
      *local_98 = (u8)iVar6;
      return 0;
    }
    pMem2 = pMem2 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1 = aKey1[1];
    if( s1<0x80 ){
      idx1 = 2;
    }else{
      idx1 = 1 + sqlite3GetVarint32(&aKey1[1], &s1);
    }
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    if( (szHdr1 = aKey1[0])<0x80 ){
      idx1 = 1;
    }else{
      idx1 = sqlite3GetVarint32(aKey1, &szHdr1);
    }
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortFlags!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  while( 1 /*exit-by-break*/ ){
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = serial_type==10 ? -1 : +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n;
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0 && serial_type!=10);
    }

    if( rc!=0 ){
      int sortFlags = pPKey2->pKeyInfo->aSortFlags[i];
      if( sortFlags ){
        if( (sortFlags & KEYINFO_ORDER_BIGNULL)==0
         || ((sortFlags & KEYINFO_ORDER_DESC)
           !=(serial_type==0 || (pRhs->flags&MEM_Null)))
        ){
          rc = -rc;
        }
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    if( d1>(unsigned)nKey1 ) break;
    idx1 += sqlite3VarintLen(serial_type);
    if( idx1>=(unsigned)szHdr1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;  /* Corrupt index */
    }
  }

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc)
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}